

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  ApplicationFactory local_31;
  Application local_30;
  
  ApplicationFactory::make(&local_30,&local_31);
  solitaire::Application::run(&local_30);
  solitaire::Application::~Application(&local_30);
  return 0;
}

Assistant:

int main(int, char**) try {
    ApplicationFactory {}.make().run();
    return 0;
}
catch (const std::runtime_error& e) {
    std::cout << e.what() << std::endl;
    return -1;
}